

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O2

size_t tool_header_cb(void *ptr,size_t size,size_t nmemb,void *userdata)

{
  byte bVar1;
  long lVar2;
  undefined8 *puVar3;
  FILE *__s;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  char *pcVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  uint uVar12;
  byte *pbVar13;
  byte *__s_00;
  size_t fnlen;
  
  uVar10 = nmemb * size;
  uVar9 = (ulong)(uVar10 == 0);
  lVar2 = *(long *)(*(long *)((long)userdata + 8) + 0x18);
  if (lVar2 == 0) {
    return uVar9;
  }
  puVar3 = *userdata;
  if (((*(long *)(lVar2 + 0xb8) != 0) &&
      (__s = *(FILE **)(*(long *)((long)userdata + 8) + 0x10), __s != (FILE *)0x0)) &&
     (sVar5 = fwrite(ptr,size,nmemb,__s), sVar5 != uVar10)) {
    return sVar5;
  }
  if (uVar10 < 0x15) {
    return uVar10;
  }
  if (*(char *)((long)userdata + 0x10) == '\0') {
    return uVar10;
  }
  iVar4 = Curl_raw_nequal("Content-disposition:",(char *)ptr,0x14);
  if (iVar4 == 0) {
    return uVar10;
  }
  pbVar11 = (byte *)(uVar10 + (long)ptr);
  pbVar13 = (byte *)((long)ptr + 0x14);
  while( true ) {
    while ((bVar1 = *pbVar13, pbVar13 < pbVar11 && (ulong)bVar1 != 0 &&
           (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (ulong)bVar1 * 2 + 1) & 4) == 0))
          ) {
      pbVar13 = pbVar13 + 1;
    }
    if (pbVar11 + -9 < pbVar13) {
      return uVar10;
    }
    iVar4 = bcmp(pbVar13,"filename=",9);
    if (iVar4 == 0) break;
    for (; (pbVar13 < pbVar11 && (*pbVar13 != 0x3b)); pbVar13 = pbVar13 + 1) {
    }
  }
  pcVar7 = strstr((char *)((long)ptr + 0x14),"filename*=");
  if (pcVar7 == (char *)0x0) {
    pbVar13 = pbVar13 + 9;
    pbVar11 = (byte *)malloc((long)ptr + (uVar10 - (long)pbVar13) + 1);
    if (pbVar11 == (byte *)0x0) {
      return uVar9;
    }
    sVar5 = (long)ptr + (uVar10 - (long)pbVar13);
    memcpy(pbVar11,pbVar13,sVar5);
    pbVar11[sVar5] = 0;
    bVar1 = *pbVar11;
    uVar12 = (uint)bVar1;
    if ((bVar1 == 0x27) || (bVar1 == 0x22)) {
      pbVar13 = pbVar11 + 1;
    }
    else {
      uVar12 = 0x3b;
      pbVar13 = pbVar11;
    }
    pcVar7 = strrchr((char *)pbVar11,0x2f);
    if (pcVar7 != (char *)0x0) {
      if (pcVar7[1] == '\0') goto LAB_00107eed;
      pbVar13 = (byte *)(pcVar7 + 1);
    }
    pcVar7 = strrchr((char *)pbVar13,0x5c);
    __s_00 = pbVar13;
    if (pcVar7 != (char *)0x0) {
      if (pcVar7[1] == '\0') {
LAB_00107eed:
        free(pbVar11);
        return uVar9;
      }
      pbVar13 = (byte *)(pcVar7 + 1);
      __s_00 = pbVar13;
    }
    while( true ) {
      bVar1 = *pbVar13;
      if (bVar1 == 0) break;
      if ((bVar1 == 0x5c) && (pbVar13[1] != 0)) {
        pbVar13 = pbVar13 + 1;
      }
      else if (uVar12 == (int)(char)bVar1) break;
      pbVar13 = pbVar13 + 1;
    }
    *pbVar13 = 0;
    pcVar7 = strchr((char *)__s_00,0xd);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    pcVar7 = strchr((char *)__s_00,10);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    if (pbVar11 != __s_00) {
      sVar5 = strlen((char *)__s_00);
      memmove(pbVar11,__s_00,sVar5 + 1);
    }
  }
  else {
    fnlen = 0;
    pcVar7 = strstr(pcVar7 + 10,"UTF-8\'\'");
    uVar8 = curl_easy_init();
    sVar5 = strlen(pcVar7 + 7);
    pbVar11 = (byte *)curl_easy_unescape(uVar8,pcVar7 + 7,sVar5 & 0xffffffff,&fnlen);
    curl_easy_cleanup(uVar8);
    curl_mfprintf(_stderr,"STR=%s\n\n",pbVar11);
  }
  if (pbVar11 != (byte *)0x0) {
    *puVar3 = pbVar11;
    *(undefined4 *)(puVar3 + 1) = 0x10101;
    puVar3[2] = 0;
    *(undefined1 *)((long)userdata + 0x10) = 0;
    uVar9 = uVar10;
  }
  return uVar9;
}

Assistant:

size_t tool_header_cb(void *ptr, size_t size, size_t nmemb, void *userdata)
{
  struct HdrCbData *hdrcbdata = userdata;
  struct OutStruct *outs = hdrcbdata->outs;
  struct OutStruct *heads = hdrcbdata->heads;
  const char *str = ptr;
  const size_t cb = size * nmemb;
  const char *end = (char*)ptr + cb;

  int encoded_file_name = FALSE;
  
  /*
   * Once that libcurl has called back tool_header_cb() the returned value
   * is checked against the amount that was intended to be written, if
   * it does not match then it fails with CURLE_WRITE_ERROR. So at this
   * point returning a value different from sz*nmemb indicates failure.
   */
  size_t failure = (size * nmemb) ? 0 : 1;

  if(!heads->config)
    return failure;

#ifdef DEBUGBUILD
  if(size * nmemb > (size_t)CURL_MAX_HTTP_HEADER) {
    warnf(heads->config, "Header data exceeds single call write limit!\n");
    return failure;
  }
#endif

  /*
   * Write header data when curl option --dump-header (-D) is given.
   */

  if(heads->config->headerfile && heads->stream) {
    size_t rc = fwrite(ptr, size, nmemb, heads->stream);
    if(rc != cb)
      return rc;
  }

  /*
   * This callback sets the filename where output shall be written when
   * curl options --remote-name (-O) and --remote-header-name (-J) have
   * been simultaneously given and additionally server returns an HTTP
   * Content-Disposition header specifying a filename property.
   */

  if(hdrcbdata->honor_cd_filename &&
     (cb > 20) && checkprefix("Content-disposition:", str)) {
    const char *p = str + 20;

    /* look for the 'filename=' parameter
       (encoded filenames (*=) are not supported) */
    for(;;) {
      char *filename;
      size_t len;
	  char* enc_ptr;	  

      while(*p && (p < end) && !ISALPHA(*p))
        p++;
      if(p > end - 9)
        break;

      if(memcmp(p, "filename=", 9)) {
        /* no match, find next parameter */
        while((p < end) && (*p != ';'))
          p++;
        continue;
      }
      p += 9;

	  enc_ptr = strstr(str + 20, "filename*=");
      if (enc_ptr) {
	  	char* fntmp = NULL;
		size_t fnlen = 0;
        enc_ptr += 10;

		fntmp = strstr(enc_ptr, "UTF-8''");
				
		if (fntmp != NULL) 
		{
			CURL* curl;
			curl = curl_easy_init();
			filename = curl_easy_unescape(curl,  fntmp + 7, strlen(fntmp + 7),&fnlen);
			curl_easy_cleanup(curl);
		}
        encoded_file_name = TRUE;

		//filename = strdup
		fprintf(stderr, "STR=%s\n\n", filename);
      }
	  
      /* this expression below typecasts 'cb' only to avoid
         warning: signed and unsigned type in conditional expression
      */
      len = (ssize_t)cb - (p - str);
	  if (encoded_file_name == FALSE)
		filename = parse_filename(p, len);

      if(filename) {
        outs->filename = filename;
        outs->alloc_filename = TRUE;
        outs->is_cd_filename = TRUE;
        outs->s_isreg = TRUE;
        outs->fopened = FALSE;
        outs->stream = NULL;
        hdrcbdata->honor_cd_filename = FALSE;
        break;
      }
      else
        return failure;
    }
  }

  return cb;
}